

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

void __thiscall cmELF::cmELF(cmELF *this,char *fname)

{
  byte bVar1;
  basic_ifstream<char,_std::char_traits<char>_> *pbVar2;
  long *plVar3;
  cmELFInternalImpl<cmELFTypes32> *this_00;
  cmELFInternalImpl<cmELFTypes64> *this_01;
  ByteOrderType local_5c;
  undefined1 auStack_58 [4];
  ByteOrderType order;
  __mbstate_t local_50;
  char local_48;
  char local_47;
  char local_46;
  char local_45;
  char local_44;
  char local_43;
  char ident [16];
  auto_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> local_20;
  auto_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> fin;
  char *fname_local;
  cmELF *this_local;
  
  this->Internal = (cmELFInternal *)0x0;
  fin.x_ = (basic_ifstream<char,_std::char_traits<char>_> *)fname;
  std::__cxx11::string::string((string *)&this->ErrorMessage);
  pbVar2 = (basic_ifstream<char,_std::char_traits<char>_> *)operator_new(0x208);
  std::ifstream::ifstream(pbVar2,(char *)fin.x_,_S_in);
  cm::auto_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>::auto_ptr(&local_20,pbVar2);
  pbVar2 = cm::auto_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>::get(&local_20);
  if (pbVar2 != (basic_ifstream<char,_std::char_traits<char>_> *)0x0) {
    pbVar2 = cm::auto_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>::operator*(&local_20)
    ;
    bVar1 = std::ios::operator!((ios *)(pbVar2 + *(long *)(*(long *)pbVar2 + -0x18)));
    if ((bVar1 & 1) == 0) {
      pbVar2 = cm::auto_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>::operator->
                         (&local_20);
      plVar3 = (long *)std::istream::read((char *)pbVar2,(long)&local_48);
      bVar1 = std::ios::operator!((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
      if ((bVar1 & 1) == 0) {
        pbVar2 = cm::auto_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>::operator->
                           (&local_20);
        std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)auStack_58,0);
        plVar3 = (long *)std::istream::seekg(pbVar2,_auStack_58,local_50);
        bVar1 = std::ios::operator!((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
        if ((bVar1 & 1) == 0) {
          if ((((local_48 == '\x7f') && (local_47 == 'E')) && (local_46 == 'L')) &&
             (local_45 == 'F')) {
            if (local_43 == '\x01') {
              local_5c = ByteOrderLSB;
            }
            else {
              if (local_43 != '\x02') {
                std::__cxx11::string::operator=
                          ((string *)&this->ErrorMessage,"ELF file is not LSB or MSB encoded.");
                goto LAB_001653c0;
              }
              local_5c = ByteOrderMSB;
            }
            if (local_44 == '\x01') {
              this_00 = (cmELFInternalImpl<cmELFTypes32> *)operator_new(0xc0);
              cmELFInternalImpl<cmELFTypes32>::cmELFInternalImpl(this_00,this,&local_20,local_5c);
              this->Internal = (cmELFInternal *)this_00;
            }
            else if (local_44 == '\x02') {
              this_01 = (cmELFInternalImpl<cmELFTypes64> *)operator_new(200);
              cmELFInternalImpl<cmELFTypes64>::cmELFInternalImpl(this_01,this,&local_20,local_5c);
              this->Internal = (cmELFInternal *)this_01;
            }
            else {
              std::__cxx11::string::operator=
                        ((string *)&this->ErrorMessage,"ELF file class is not 32-bit or 64-bit.");
            }
          }
          else {
            std::__cxx11::string::operator=
                      ((string *)&this->ErrorMessage,
                       "File does not have a valid ELF identification.");
          }
        }
        else {
          std::__cxx11::string::operator=
                    ((string *)&this->ErrorMessage,"Error seeking to beginning of file.");
        }
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)&this->ErrorMessage,"Error reading ELF identification.");
      }
      goto LAB_001653c0;
    }
  }
  std::__cxx11::string::operator=((string *)&this->ErrorMessage,"Error opening input file.");
LAB_001653c0:
  cm::auto_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>::~auto_ptr(&local_20);
  return;
}

Assistant:

cmELF::cmELF(const char* fname)
  : Internal(CM_NULLPTR)
{
  // Try to open the file.
  CM_AUTO_PTR<cmsys::ifstream> fin(new cmsys::ifstream(fname));

  // Quit now if the file could not be opened.
  if (!fin.get() || !*fin) {
    this->ErrorMessage = "Error opening input file.";
    return;
  }

  // Read the ELF identification block.
  char ident[EI_NIDENT];
  if (!fin->read(ident, EI_NIDENT)) {
    this->ErrorMessage = "Error reading ELF identification.";
    return;
  }
  if (!fin->seekg(0)) {
    this->ErrorMessage = "Error seeking to beginning of file.";
    return;
  }

  // Verify the ELF identification.
  if (!(ident[EI_MAG0] == ELFMAG0 && ident[EI_MAG1] == ELFMAG1 &&
        ident[EI_MAG2] == ELFMAG2 && ident[EI_MAG3] == ELFMAG3)) {
    this->ErrorMessage = "File does not have a valid ELF identification.";
    return;
  }

  // Check the byte order in which the rest of the file is encoded.
  cmELFInternal::ByteOrderType order;
  if (ident[EI_DATA] == ELFDATA2LSB) {
    // File is LSB.
    order = cmELFInternal::ByteOrderLSB;
  } else if (ident[EI_DATA] == ELFDATA2MSB) {
    // File is MSB.
    order = cmELFInternal::ByteOrderMSB;
  } else {
    this->ErrorMessage = "ELF file is not LSB or MSB encoded.";
    return;
  }

  // Check the class of the file and construct the corresponding
  // parser implementation.
  if (ident[EI_CLASS] == ELFCLASS32) {
    // 32-bit ELF
    this->Internal = new cmELFInternalImpl<cmELFTypes32>(this, fin, order);
  }
#ifndef _SCO_DS
  else if (ident[EI_CLASS] == ELFCLASS64) {
    // 64-bit ELF
    this->Internal = new cmELFInternalImpl<cmELFTypes64>(this, fin, order);
  }
#endif
  else {
    this->ErrorMessage = "ELF file class is not 32-bit or 64-bit.";
    return;
  }